

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfCommonHandler.c
# Opt level: O0

uint32_t sbfMcastTopicResolver_makeAddress(sbfMcastTopicResolver mtr,sbfTopic topic)

{
  uint uVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined4 uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  void *pvVar9;
  undefined8 in_RSI;
  long in_RDI;
  uint32_t address;
  uint32_t h;
  
  uVar5 = ntohl(*(uint32_t *)(in_RDI + 8));
  pvVar9 = (void *)sbfTopic_getFirst(in_RSI);
  uVar6 = hash32_str(pvVar9,0x1505);
  uVar1 = *(uint *)(in_RDI + 0xc);
  uVar2 = *(undefined4 *)(in_RDI + 0x18);
  pvVar9 = (void *)sbfTopic_getSecond(in_RSI);
  uVar7 = hash32_str(pvVar9,0x1505);
  uVar3 = *(uint *)(in_RDI + 0x10);
  uVar4 = *(undefined4 *)(in_RDI + 0x1c);
  pvVar9 = (void *)sbfTopic_getThird(in_RSI);
  uVar8 = hash32_str(pvVar9,0x1505);
  uVar5 = htonl(uVar8 % *(uint *)(in_RDI + 0x14) + 1 |
                uVar7 % uVar3 << ((byte)uVar4 & 0x1f) |
                uVar6 % uVar1 << ((byte)uVar2 & 0x1f) | uVar5);
  return uVar5;
}

Assistant:

uint32_t
sbfMcastTopicResolver_makeAddress (sbfMcastTopicResolver mtr, sbfTopic topic)
{
    uint32_t h;
    uint32_t address;

    address = ntohl (mtr->mBase);

    h = hash32_str (sbfTopic_getFirst (topic), HASHINIT);
    address |= (h % mtr->mFirstSize) << mtr->mFirstShift;

    h = hash32_str (sbfTopic_getSecond (topic), HASHINIT);
    address |= (h % mtr->mSecondSize) << mtr->mSecondShift;

    h = hash32_str (sbfTopic_getThird (topic), HASHINIT);
    address |= 1 + (h % mtr->mThirdSize);

    return htonl (address);
}